

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::
    reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_d,bool reduce_c,
              bool post_process,float coeff,int keepdims,Option *opt)

{
  size_t sVar1;
  Allocator *pAVar2;
  size_t sVar3;
  int iVar4;
  int *piVar5;
  int k_2;
  Mat *pMVar6;
  Mat *pMVar7;
  Mat *pMVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  int iVar13;
  undefined7 in_register_00000009;
  int iVar14;
  uint uVar15;
  undefined7 in_register_00000011;
  Mat *pMVar16;
  void *pvVar17;
  int j;
  uint uVar18;
  Mat *pMVar19;
  Mat *pMVar20;
  int j_9;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  char cVar24;
  byte bVar25;
  size_t sVar26;
  Mat *pMVar27;
  byte bVar28;
  size_t sVar29;
  undefined7 in_register_00000089;
  ulong uVar30;
  bool bVar31;
  int i_16;
  int i_3;
  uint uVar32;
  Mat *pMVar33;
  ulong uVar34;
  int k;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  int j_8;
  uint uVar38;
  uint uVar39;
  float fVar40;
  undefined3 in_stack_00000009;
  undefined4 in_stack_00000014;
  int local_a0;
  Mat local_88;
  int local_40;
  int local_3c;
  long local_38;
  
  pMVar27 = b;
  if (3 < a->dims - 1U) goto LAB_00308ffe;
  lVar37 = CONCAT44(in_stack_00000014,keepdims);
  sVar1 = a->elemsize;
  switch(a->dims) {
  case 1:
    uVar15 = a->w;
    pMVar27 = (Mat *)0x1;
    Mat::create(b,1,sVar1,*(Allocator **)(lVar37 + 8));
    uVar23 = 0;
    uVar22 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar22 = uVar23;
    }
    fVar40 = 0.0;
    for (; uVar22 != uVar23; uVar23 = uVar23 + 1) {
      fVar40 = fVar40 + ABS(*(float *)((long)a->data + uVar23 * 4));
    }
    *(float *)b->data = fVar40;
    goto LAB_00308ffe;
  case 2:
    uVar15 = a->w;
    uVar38 = a->h;
    uVar22 = CONCAT71(in_register_00000011,reduce_w) & 0xffffffff;
    bVar25 = (byte)uVar22 ^ 1;
    if (bVar25 != 0 || !reduce_h) {
      bVar25 = bVar25 | reduce_h;
      pMVar27 = (Mat *)CONCAT71((int7)(uVar22 >> 8),bVar25);
      if (bVar25 == 0) {
        if (_post_process == 0) {
          Mat::create(b,uVar38,sVar1,*(Allocator **)(lVar37 + 8));
        }
        else {
          Mat::create(b,1,uVar38,sVar1,*(Allocator **)(lVar37 + 8));
        }
        pvVar9 = a->data;
        iVar13 = a->w;
        sVar1 = a->elemsize;
        pvVar12 = b->data;
        pMVar27 = (Mat *)0x0;
        pMVar6 = (Mat *)(ulong)uVar15;
        if ((int)uVar15 < 1) {
          pMVar6 = pMVar27;
        }
        pMVar7 = (Mat *)(ulong)uVar38;
        if ((int)uVar38 < 1) {
          pMVar7 = pMVar27;
        }
        for (; pMVar27 != pMVar7; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
          fVar40 = 0.0;
          for (pMVar8 = (Mat *)0x0; pMVar6 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            fVar40 = fVar40 + ABS(*(float *)((long)pvVar9 + (long)pMVar8 * 4));
          }
          *(float *)((long)pvVar12 + (long)pMVar27 * 4) = fVar40;
          pvVar9 = (void *)((long)pvVar9 + (long)iVar13 * sVar1);
        }
      }
      else if (reduce_h && !reduce_w) {
        if (_post_process == 0) {
          Mat::create(b,uVar15,sVar1,*(Allocator **)(lVar37 + 8));
        }
        else {
          Mat::create(b,uVar15,1,sVar1,*(Allocator **)(lVar37 + 8));
        }
        iVar13 = b->c * (int)b->cstep;
        pvVar9 = b->data;
        lVar37 = 0;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        for (; iVar13 != (int)lVar37; lVar37 = lVar37 + 1) {
          *(undefined4 *)((long)pvVar9 + lVar37 * 4) = 0;
        }
        pvVar12 = a->data;
        iVar13 = a->w;
        sVar1 = a->elemsize;
        pMVar27 = (Mat *)0x0;
        pMVar6 = (Mat *)(ulong)uVar15;
        if ((int)uVar15 < 1) {
          pMVar6 = pMVar27;
        }
        pMVar7 = (Mat *)(ulong)uVar38;
        if ((int)uVar38 < 1) {
          pMVar7 = pMVar27;
        }
        for (; pMVar27 != pMVar7; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
          for (pMVar8 = (Mat *)0x0; pMVar6 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            *(float *)((long)pvVar9 + (long)pMVar8 * 4) =
                 ABS(*(float *)((long)pvVar12 + (long)pMVar8 * 4)) +
                 *(float *)((long)pvVar9 + (long)pMVar8 * 4);
          }
          pvVar12 = (void *)((long)pvVar12 + (long)iVar13 * sVar1);
        }
      }
      goto LAB_00308ffe;
    }
    if (_post_process == 0) {
      Mat::create(b,1,sVar1,*(Allocator **)(lVar37 + 8));
    }
    else {
      Mat::create(b,1,1,sVar1,*(Allocator **)(lVar37 + 8));
    }
    local_88.cstep = 0;
    local_88.data = (Mat *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.allocator = (Allocator *)0x0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
    pMVar27 = (Mat *)(ulong)uVar38;
    Mat::create(&local_88,uVar38,sVar1,*(Allocator **)(lVar37 + 0x10));
    local_a0 = -100;
    if (((Mat *)local_88.data != (Mat *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
      pvVar9 = a->data;
      iVar13 = a->w;
      sVar1 = a->elemsize;
      pMVar27 = (Mat *)0x0;
      pMVar6 = (Mat *)(ulong)uVar15;
      if ((int)uVar15 < 1) {
        pMVar6 = pMVar27;
      }
      pMVar7 = (Mat *)(ulong)uVar38;
      if ((int)uVar38 < 1) {
        pMVar7 = pMVar27;
      }
      for (; pMVar27 != pMVar7; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
        fVar40 = 0.0;
        for (pMVar8 = (Mat *)0x0; pMVar6 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
          fVar40 = fVar40 + ABS(*(float *)((long)pvVar9 + (long)pMVar8 * 4));
        }
        *(float *)((long)(void **)local_88.data + (long)pMVar27 * 4) = fVar40;
        pvVar9 = (void *)((long)pvVar9 + (long)iVar13 * sVar1);
      }
      fVar40 = 0.0;
      for (pMVar6 = (Mat *)0x0; pMVar7 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
        fVar40 = fVar40 + *(float *)((long)(void **)local_88.data + (long)pMVar6 * 4);
      }
      *(float *)b->data = fVar40;
      local_a0 = 0;
    }
    piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_88.allocator == (Allocator *)0x0) goto LAB_00308993;
        pMVar27 = (Mat *)local_88.data;
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
    break;
  case 3:
    uVar15 = a->w;
    lVar37 = (long)(int)uVar15;
    uVar38 = a->h;
    uVar39 = a->c;
    uVar32 = uVar38 * uVar15;
    bVar31 = !reduce_h;
    pMVar27 = (Mat *)(CONCAT71(in_register_00000089,reduce_c) & 0xffffffff ^ 1);
    cVar24 = (char)pMVar27;
    if ((reduce_w && !bVar31) && cVar24 == '\0') {
      pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
      if (_post_process == 0) {
        Mat::create(b,1,sVar1,pAVar2);
      }
      else {
        Mat::create(b,1,1,1,sVar1,pAVar2);
      }
      local_88.cstep = 0;
      local_88.data = (Mat *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      pMVar27 = (Mat *)(ulong)uVar39;
      Mat::create(&local_88,uVar39,sVar1,
                  *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
      local_a0 = -100;
      if (((Mat *)local_88.data != (Mat *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
        pvVar9 = a->data;
        sVar1 = a->elemsize;
        sVar26 = a->cstep;
        pMVar27 = (Mat *)0x0;
        pMVar6 = (Mat *)(ulong)uVar32;
        if ((int)uVar32 < 1) {
          pMVar6 = pMVar27;
        }
        pMVar7 = (Mat *)(ulong)uVar39;
        if ((int)uVar39 < 1) {
          pMVar7 = pMVar27;
        }
        for (; pMVar27 != pMVar7; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
          fVar40 = 0.0;
          for (pMVar8 = (Mat *)0x0; pMVar6 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            fVar40 = fVar40 + ABS(*(float *)((long)pvVar9 + (long)pMVar8 * 4));
          }
          *(float *)((long)(void **)local_88.data + (long)pMVar27 * 4) = fVar40;
          pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar26);
        }
        fVar40 = 0.0;
        for (pMVar6 = (Mat *)0x0; pMVar7 != pMVar6; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
          fVar40 = fVar40 + *(float *)((long)(void **)local_88.data + (long)pMVar6 * 4);
        }
        *(float *)b->data = fVar40;
        local_a0 = 0;
      }
      piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_88.allocator == (Allocator *)0x0) goto LAB_00308993;
          pMVar27 = (Mat *)local_88.data;
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      if ((reduce_w && !bVar31) && !reduce_c) {
        pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar39,sVar1,pAVar2);
        }
        else {
          Mat::create(b,1,1,uVar39,sVar1,pAVar2);
        }
        pvVar9 = a->data;
        sVar1 = b->elemsize;
        sVar26 = b->cstep;
        uVar23 = 0;
        uVar22 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          uVar22 = uVar23;
        }
        uVar30 = (ulong)uVar39;
        if ((int)uVar39 < 1) {
          uVar30 = uVar23;
        }
        pvVar12 = b->data;
        pMVar27 = (Mat *)(a->elemsize * a->cstep);
        for (; uVar23 != uVar30; uVar23 = uVar23 + 1) {
          fVar40 = 0.0;
          for (uVar36 = 0; uVar22 != uVar36; uVar36 = uVar36 + 1) {
            fVar40 = fVar40 + ABS(*(float *)((long)pvVar9 + uVar36 * 4));
          }
          lVar37 = sVar1 * sVar26 * uVar23;
          if (_post_process == 0) {
            lVar37 = uVar23 * 4;
          }
          *(float *)((long)pvVar12 + lVar37) = fVar40;
          pvVar9 = (void *)((long)&pMVar27->data + (long)pvVar9);
        }
        goto LAB_00308ffe;
      }
      if ((reduce_w && !reduce_h) && cVar24 == '\0') {
        pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar38,sVar1,pAVar2);
        }
        else {
          Mat::create(b,1,uVar38,1,sVar1,pAVar2);
        }
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar27 = (Mat *)0x1;
        Mat::create(&local_88,1,uVar38,uVar39,sVar1,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        local_a0 = -100;
        if ((Mat *)local_88.data != (Mat *)0x0) {
          pMVar27 = (Mat *)(local_88.cstep * (long)local_88.c);
          if (pMVar27 != (Mat *)0x0) {
            uVar32 = (int)local_88.cstep * local_88.c;
            uVar23 = 0;
            uVar22 = (ulong)uVar32;
            if ((int)uVar32 < 1) {
              uVar22 = uVar23;
            }
            for (; (int)uVar22 != (int)uVar23; uVar23 = uVar23 + 1) {
              *(undefined4 *)((long)(void **)local_88.data + uVar23 * 4) = 0;
            }
            pvVar9 = a->data;
            uVar22 = 0;
            pMVar27 = (Mat *)0x0;
            if (0 < (int)uVar15) {
              pMVar27 = (Mat *)(ulong)uVar15;
            }
            sVar1 = a->elemsize;
            uVar23 = (ulong)uVar38;
            if ((int)uVar38 < 1) {
              uVar23 = uVar22;
            }
            uVar30 = (ulong)uVar39;
            if ((int)uVar39 < 1) {
              uVar30 = uVar22;
            }
            sVar26 = a->cstep;
            for (; uVar22 != uVar30; uVar22 = uVar22 + 1) {
              pvVar12 = pvVar9;
              for (uVar36 = 0; uVar36 != uVar23; uVar36 = uVar36 + 1) {
                fVar40 = 0.0;
                for (pMVar6 = (Mat *)0x0; pMVar27 != pMVar6;
                    pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
                  fVar40 = fVar40 + ABS(*(float *)((long)pvVar12 + (long)pMVar6 * 4));
                }
                *(float *)((long)(void **)local_88.data +
                          uVar36 * 4 +
                          CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                          local_88.cstep * uVar22) = fVar40;
                pvVar12 = (void *)((long)pvVar12 + lVar37 * 4);
              }
              pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar26);
            }
            uVar15 = b->c * (int)b->cstep;
            pvVar9 = b->data;
            uVar36 = 0;
            uVar22 = (ulong)uVar15;
            if ((int)uVar15 < 1) {
              uVar22 = uVar36;
            }
            for (; (int)uVar22 != (int)uVar36; uVar36 = uVar36 + 1) {
              *(undefined4 *)((long)pvVar9 + uVar36 * 4) = 0;
            }
            pMVar6 = (Mat *)local_88.data;
            for (uVar22 = 0; uVar22 != uVar30; uVar22 = uVar22 + 1) {
              pMVar27 = (Mat *)b->data;
              for (uVar36 = 0; uVar23 != uVar36; uVar36 = uVar36 + 1) {
                *(float *)((long)&pMVar27->data + uVar36 * 4) =
                     *(float *)((long)&pMVar6->data + uVar36 * 4) +
                     *(float *)((long)&pMVar27->data + uVar36 * 4);
              }
              pMVar6 = (Mat *)((long)&pMVar6->data +
                              CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                              local_88.cstep);
            }
            local_a0 = 0;
          }
        }
        piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_88.allocator == (Allocator *)0x0) {
LAB_00308993:
              pMVar27 = (Mat *)local_88.data;
              free(local_88.data);
            }
            else {
              pMVar27 = (Mat *)local_88.data;
              (*(local_88.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if ((bVar31 || reduce_w) || cVar24 != '\0') {
          if ((reduce_w && !reduce_h) && !reduce_c) {
            pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
            if (_post_process == 0) {
              Mat::create(b,uVar38,uVar39,sVar1,pAVar2);
            }
            else {
              Mat::create(b,1,uVar38,uVar39,sVar1,pAVar2);
            }
            uVar22 = 0;
            uVar23 = 0;
            if (0 < (int)uVar15) {
              uVar23 = (ulong)uVar15;
            }
            uVar30 = (ulong)uVar38;
            if ((int)uVar38 < 1) {
              uVar30 = uVar22;
            }
            uVar36 = (ulong)uVar39;
            if ((int)uVar39 < 1) {
              uVar36 = uVar22;
            }
            sVar1 = a->elemsize;
            if (_post_process == 0) {
              sVar26 = (size_t)b->w;
            }
            else {
              sVar26 = b->cstep;
            }
            pvVar9 = a->data;
            pvVar12 = b->data;
            pMVar27 = (Mat *)(sVar26 * b->elemsize);
            sVar26 = a->cstep;
            for (; uVar22 != uVar36; uVar22 = uVar22 + 1) {
              pvVar17 = pvVar9;
              for (uVar34 = 0; uVar34 != uVar30; uVar34 = uVar34 + 1) {
                fVar40 = 0.0;
                for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
                  fVar40 = fVar40 + ABS(*(float *)((long)pvVar17 + uVar21 * 4));
                }
                *(float *)((long)pvVar12 + uVar34 * 4 + (long)pMVar27 * uVar22) = fVar40;
                pvVar17 = (void *)((long)pvVar17 + lVar37 * 4);
              }
              pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar26);
            }
          }
          else if ((reduce_w || reduce_h) || cVar24 != '\0') {
            if ((!bVar31 && !reduce_w) && !reduce_c) {
              pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
              if (_post_process == 0) {
                Mat::create(b,uVar15,uVar39,sVar1,pAVar2);
              }
              else {
                Mat::create(b,uVar15,1,uVar39,sVar1,pAVar2);
              }
              iVar13 = b->c * (int)b->cstep;
              pvVar9 = b->data;
              lVar11 = 0;
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              for (; iVar13 != (int)lVar11; lVar11 = lVar11 + 1) {
                *(undefined4 *)((long)pvVar9 + lVar11 * 4) = 0;
              }
              uVar22 = 0;
              uVar23 = 0;
              if (0 < (int)uVar15) {
                uVar23 = (ulong)uVar15;
              }
              if ((int)uVar38 < 1) {
                uVar38 = 0;
              }
              if ((int)uVar39 < 1) {
                uVar39 = 0;
              }
              sVar1 = a->elemsize;
              if (_post_process == 0) {
                sVar26 = (size_t)b->w;
              }
              else {
                sVar26 = b->cstep;
              }
              pvVar9 = a->data;
              pvVar12 = b->data;
              pMVar27 = (Mat *)(sVar26 * b->elemsize);
              sVar26 = a->cstep;
              for (; uVar22 != uVar39; uVar22 = uVar22 + 1) {
                pvVar17 = pvVar9;
                for (uVar15 = 0; uVar15 != uVar38; uVar15 = uVar15 + 1) {
                  for (uVar30 = 0; uVar23 != uVar30; uVar30 = uVar30 + 1) {
                    *(float *)((long)pvVar12 + uVar30 * 4) =
                         ABS(*(float *)((long)pvVar17 + uVar30 * 4)) +
                         *(float *)((long)pvVar12 + uVar30 * 4);
                  }
                  pvVar17 = (void *)((long)pvVar17 + lVar37 * 4);
                }
                pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar26);
                pvVar12 = (void *)((long)&pMVar27->data + (long)pvVar12);
              }
            }
          }
          else {
            pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
            if (_post_process == 0) {
              pMVar27 = (Mat *)(ulong)uVar15;
              Mat::create(b,uVar15,uVar38,sVar1,pAVar2);
            }
            else {
              pMVar27 = (Mat *)(ulong)uVar15;
              Mat::create(b,uVar15,uVar38,1,sVar1,pAVar2);
            }
            iVar13 = b->c * (int)b->cstep;
            pvVar9 = b->data;
            lVar37 = 0;
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            for (; iVar13 != (int)lVar37; lVar37 = lVar37 + 1) {
              *(undefined4 *)((long)pvVar9 + lVar37 * 4) = 0;
            }
            pvVar9 = a->data;
            sVar1 = a->elemsize;
            sVar26 = a->cstep;
            uVar23 = 0;
            uVar22 = (ulong)uVar32;
            if ((int)uVar32 < 1) {
              uVar22 = uVar23;
            }
            uVar30 = (ulong)uVar39;
            if ((int)uVar39 < 1) {
              uVar30 = uVar23;
            }
            for (; uVar23 != uVar30; uVar23 = uVar23 + 1) {
              pMVar27 = (Mat *)b->data;
              for (uVar36 = 0; uVar22 != uVar36; uVar36 = uVar36 + 1) {
                *(float *)((long)&pMVar27->data + uVar36 * 4) =
                     ABS(*(float *)((long)pvVar9 + uVar36 * 4)) +
                     *(float *)((long)&pMVar27->data + uVar36 * 4);
              }
              pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar26);
            }
          }
          goto LAB_00308ffe;
        }
        pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar15,sVar1,pAVar2);
        }
        else {
          Mat::create(b,uVar15,1,1,sVar1,pAVar2);
        }
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar27 = (Mat *)(ulong)uVar15;
        Mat::create(&local_88,uVar15,1,uVar39,sVar1,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        local_a0 = -100;
        if ((Mat *)local_88.data != (Mat *)0x0) {
          pMVar27 = (Mat *)(local_88.cstep * (long)local_88.c);
          if (pMVar27 != (Mat *)0x0) {
            uVar32 = (int)local_88.cstep * local_88.c;
            uVar23 = 0;
            uVar22 = (ulong)uVar32;
            if ((int)uVar32 < 1) {
              uVar22 = uVar23;
            }
            for (; (int)uVar22 != (int)uVar23; uVar23 = uVar23 + 1) {
              *(undefined4 *)((long)(void **)local_88.data + uVar23 * 4) = 0;
            }
            pvVar9 = a->data;
            sVar1 = a->elemsize;
            pMVar27 = (Mat *)0x0;
            uVar22 = 0;
            if (0 < (int)uVar15) {
              uVar22 = (ulong)uVar15;
            }
            if ((int)uVar38 < 1) {
              uVar38 = 0;
            }
            pMVar6 = (Mat *)(ulong)uVar39;
            if ((int)uVar39 < 1) {
              pMVar6 = pMVar27;
            }
            sVar26 = a->cstep;
            pMVar7 = (Mat *)local_88.data;
            for (; pMVar27 != pMVar6; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
              pvVar12 = pvVar9;
              for (uVar15 = 0; uVar15 != uVar38; uVar15 = uVar15 + 1) {
                for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                  *(float *)((long)&pMVar7->data + uVar23 * 4) =
                       ABS(*(float *)((long)pvVar12 + uVar23 * 4)) +
                       *(float *)((long)&pMVar7->data + uVar23 * 4);
                }
                pvVar12 = (void *)((long)pvVar12 + lVar37 * 4);
              }
              pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar26);
              pMVar7 = (Mat *)((long)&pMVar7->data +
                              CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                              local_88.cstep);
            }
            uVar15 = b->c * (int)b->cstep;
            pvVar9 = b->data;
            uVar30 = 0;
            uVar23 = (ulong)uVar15;
            if ((int)uVar15 < 1) {
              uVar23 = uVar30;
            }
            for (; (int)uVar23 != (int)uVar30; uVar30 = uVar30 + 1) {
              *(undefined4 *)((long)pvVar9 + uVar30 * 4) = 0;
            }
            pMVar7 = (Mat *)local_88.data;
            for (pMVar27 = (Mat *)0x0; pMVar27 != pMVar6;
                pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
              pvVar9 = b->data;
              for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                *(float *)((long)pvVar9 + uVar23 * 4) =
                     *(float *)((long)&pMVar7->data + uVar23 * 4) +
                     *(float *)((long)pvVar9 + uVar23 * 4);
              }
              pMVar7 = (Mat *)((long)&pMVar7->data +
                              CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                              local_88.cstep);
            }
            local_a0 = 0;
          }
        }
        piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_88.allocator == (Allocator *)0x0) goto LAB_00308993;
            pMVar27 = (Mat *)local_88.data;
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    break;
  case 4:
    uVar15 = a->w;
    lVar37 = (long)(int)uVar15;
    uVar38 = a->h;
    uVar39 = a->d;
    uVar32 = a->c;
    pMVar6 = (Mat *)(ulong)uVar32;
    uVar35 = uVar38 * uVar15;
    uVar18 = uVar35 * uVar39;
    uVar22 = CONCAT71(in_register_00000009,reduce_h) & 0xffffffff;
    bVar25 = (byte)uVar22 ^ 1;
    bVar31 = !reduce_d;
    local_38 = CONCAT71(local_38._1_7_,bVar31);
    pMVar27 = pMVar6;
    if (((reduce_w && bVar25 == 0) && !bVar31) && reduce_c) {
      pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
      if (_post_process == 0) {
        Mat::create(b,1,sVar1,pAVar2);
      }
      else {
        Mat::create(b,1,1,1,1,sVar1,pAVar2);
      }
      local_a0 = -100;
      local_88.cstep = 0;
      local_88.data = (Mat *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      Mat::create(&local_88,uVar32,sVar1,
                  *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
      if (((Mat *)local_88.data != (Mat *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
        pvVar9 = a->data;
        sVar1 = a->elemsize;
        sVar26 = a->cstep;
        pMVar27 = (Mat *)0x0;
        pMVar7 = (Mat *)(ulong)uVar18;
        if ((int)uVar18 < 1) {
          pMVar7 = pMVar27;
        }
        if ((int)uVar32 < 1) {
          pMVar6 = pMVar27;
        }
        for (; pMVar27 != pMVar6; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
          fVar40 = 0.0;
          for (pMVar8 = (Mat *)0x0; pMVar7 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            fVar40 = fVar40 + ABS(*(float *)((long)pvVar9 + (long)pMVar8 * 4));
          }
          *(float *)((long)(void **)local_88.data + (long)pMVar27 * 4) = fVar40;
          pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar26);
        }
        fVar40 = 0.0;
        for (pMVar7 = (Mat *)0x0; pMVar6 != pMVar7; pMVar7 = (Mat *)((long)&pMVar7->data + 1)) {
          fVar40 = fVar40 + *(float *)((long)(void **)local_88.data + (long)pMVar7 * 4);
        }
        *(float *)b->data = fVar40;
        local_a0 = 0;
      }
      piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          pMVar27 = (Mat *)local_88.data;
          if (local_88.allocator == (Allocator *)0x0) {
            free(local_88.data);
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      if (((reduce_w && bVar25 == 0) && !bVar31) && !reduce_c) {
        pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar32,sVar1,pAVar2);
        }
        else {
          Mat::create(b,1,1,1,uVar32,sVar1,pAVar2);
        }
        pvVar9 = a->data;
        sVar1 = b->elemsize;
        sVar26 = b->cstep;
        pMVar7 = (Mat *)0x0;
        pMVar6 = (Mat *)(ulong)uVar18;
        if ((int)uVar18 < 1) {
          pMVar6 = pMVar7;
        }
        pMVar8 = (Mat *)(ulong)uVar32;
        if ((int)uVar32 < 1) {
          pMVar8 = pMVar7;
        }
        pvVar12 = b->data;
        pMVar27 = (Mat *)(a->elemsize * a->cstep);
        for (; pMVar7 != pMVar8; pMVar7 = (Mat *)((long)&pMVar7->data + 1)) {
          fVar40 = 0.0;
          for (pMVar16 = (Mat *)0x0; pMVar6 != pMVar16; pMVar16 = (Mat *)((long)&pMVar16->data + 1))
          {
            fVar40 = fVar40 + ABS(*(float *)((long)pvVar9 + (long)pMVar16 * 4));
          }
          lVar37 = sVar1 * sVar26 * (long)pMVar7;
          if (_post_process == 0) {
            lVar37 = (long)pMVar7 * 4;
          }
          *(float *)((long)pvVar12 + lVar37) = fVar40;
          pvVar9 = (void *)((long)&pMVar27->data + (long)pvVar9);
        }
        goto LAB_00308ffe;
      }
      if (((reduce_w && bVar25 == 0) && !reduce_d) && reduce_c) {
        pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar39,sVar1,pAVar2);
        }
        else {
          Mat::create(b,1,1,uVar39,1,sVar1,pAVar2);
        }
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar27 = (Mat *)0x1;
        Mat::create(&local_88,1,uVar39,uVar32,sVar1,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        local_a0 = -100;
        if ((Mat *)local_88.data != (Mat *)0x0) {
          pMVar27 = (Mat *)(local_88.cstep * (long)local_88.c);
          if (pMVar27 != (Mat *)0x0) {
            iVar13 = (int)local_88.cstep * local_88.c;
            lVar37 = 0;
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            for (; iVar13 != (int)lVar37; lVar37 = lVar37 + 1) {
              *(undefined4 *)((long)(void **)local_88.data + lVar37 * 4) = 0;
            }
            pvVar9 = a->data;
            pMVar27 = (Mat *)0x0;
            pMVar7 = (Mat *)(ulong)uVar35;
            if ((int)uVar35 < 1) {
              pMVar7 = pMVar27;
            }
            sVar1 = a->elemsize;
            pMVar8 = (Mat *)(ulong)uVar39;
            if ((int)uVar39 < 1) {
              pMVar8 = pMVar27;
            }
            if ((int)uVar32 < 1) {
              pMVar6 = pMVar27;
            }
            sVar26 = a->cstep;
            for (; pMVar27 != pMVar6; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
              pvVar12 = pvVar9;
              for (pMVar16 = (Mat *)0x0; pMVar16 != pMVar8;
                  pMVar16 = (Mat *)((long)&pMVar16->data + 1)) {
                fVar40 = 0.0;
                for (pMVar19 = (Mat *)0x0; pMVar7 != pMVar19;
                    pMVar19 = (Mat *)((long)&pMVar19->data + 1)) {
                  fVar40 = fVar40 + ABS(*(float *)((long)pvVar12 + (long)pMVar19 * 4));
                }
                *(float *)((long)(void **)local_88.data +
                          (long)pMVar16 * 4 +
                          CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                          local_88.cstep * (long)pMVar27) = fVar40;
                pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar35 * 4);
              }
              pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar26);
            }
            uVar15 = b->c * (int)b->cstep;
            pvVar9 = b->data;
            uVar23 = 0;
            uVar22 = (ulong)uVar15;
            if ((int)uVar15 < 1) {
              uVar22 = uVar23;
            }
            for (; (int)uVar22 != (int)uVar23; uVar23 = uVar23 + 1) {
              *(undefined4 *)((long)pvVar9 + uVar23 * 4) = 0;
            }
            pMVar7 = (Mat *)local_88.data;
            for (pMVar16 = (Mat *)0x0; pMVar16 != pMVar6;
                pMVar16 = (Mat *)((long)&pMVar16->data + 1)) {
              pMVar27 = (Mat *)b->data;
              for (pMVar19 = (Mat *)0x0; pMVar8 != pMVar19;
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1)) {
                *(float *)((long)&pMVar27->data + (long)pMVar19 * 4) =
                     *(float *)((long)&pMVar7->data + (long)pMVar19 * 4) +
                     *(float *)((long)&pMVar27->data + (long)pMVar19 * 4);
              }
              pMVar7 = (Mat *)((long)&pMVar7->data +
                              CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                              local_88.cstep);
            }
            local_a0 = 0;
          }
        }
        piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_88.allocator == (Allocator *)0x0) goto LAB_00308993;
            pMVar27 = (Mat *)local_88.data;
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      else if (((reduce_w && !reduce_h) && !bVar31) && reduce_c) {
        pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar38,sVar1,pAVar2);
        }
        else {
          Mat::create(b,1,uVar38,1,1,sVar1,pAVar2);
        }
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar27 = (Mat *)0x1;
        Mat::create(&local_88,1,uVar38,uVar32,sVar1,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        local_a0 = -100;
        if ((Mat *)local_88.data != (Mat *)0x0) {
          pMVar27 = (Mat *)(local_88.cstep * (long)local_88.c);
          if (pMVar27 != (Mat *)0x0) {
            iVar13 = (int)local_88.cstep * local_88.c;
            lVar11 = 0;
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            for (; iVar13 != (int)lVar11; lVar11 = lVar11 + 1) {
              *(undefined4 *)((long)(void **)local_88.data + lVar11 * 4) = 0;
            }
            pvVar9 = a->data;
            sVar1 = a->elemsize;
            sVar26 = a->cstep;
            pMVar27 = (Mat *)0x0;
            uVar22 = 0;
            if (0 < (int)uVar15) {
              uVar22 = (ulong)uVar15;
            }
            pMVar7 = (Mat *)(ulong)uVar38;
            if ((int)uVar38 < 1) {
              pMVar7 = pMVar27;
            }
            if ((int)uVar39 < 1) {
              uVar39 = 0;
            }
            if ((int)uVar32 < 1) {
              pMVar6 = pMVar27;
            }
            for (; pMVar27 != pMVar6; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
              pvVar12 = (void *)(sVar1 * sVar26 * (long)pMVar27 + (long)pvVar9);
              lVar11 = CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                       local_88.cstep * (long)pMVar27;
              for (uVar15 = 0; uVar15 != uVar39; uVar15 = uVar15 + 1) {
                for (pMVar8 = (Mat *)0x0; pMVar8 != pMVar7;
                    pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
                  for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                    *(float *)((long)(void **)local_88.data + (long)pMVar8 * 4 + lVar11) =
                         ABS(*(float *)((long)pvVar12 + uVar23 * 4)) +
                         *(float *)((long)(void **)local_88.data + (long)pMVar8 * 4 + lVar11);
                  }
                  pvVar12 = (void *)((long)pvVar12 + lVar37 * 4);
                }
              }
            }
            uVar15 = b->c * (int)b->cstep;
            pvVar9 = b->data;
            uVar23 = 0;
            uVar22 = (ulong)uVar15;
            if ((int)uVar15 < 1) {
              uVar22 = uVar23;
            }
            for (; (int)uVar22 != (int)uVar23; uVar23 = uVar23 + 1) {
              *(undefined4 *)((long)pvVar9 + uVar23 * 4) = 0;
            }
            local_a0 = 0;
            pMVar8 = (Mat *)local_88.data;
            for (pMVar16 = (Mat *)0x0; pMVar16 != pMVar6;
                pMVar16 = (Mat *)((long)&pMVar16->data + 1)) {
              pMVar27 = (Mat *)b->data;
              for (pMVar19 = (Mat *)0x0; pMVar7 != pMVar19;
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1)) {
                *(float *)((long)&pMVar27->data + (long)pMVar19 * 4) =
                     *(float *)((long)&pMVar8->data + (long)pMVar19 * 4) +
                     *(float *)((long)&pMVar27->data + (long)pMVar19 * 4);
              }
              pMVar8 = (Mat *)((long)&pMVar8->data +
                              CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                              local_88.cstep);
            }
          }
        }
        piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_88.allocator == (Allocator *)0x0) goto LAB_00308993;
            pMVar27 = (Mat *)local_88.data;
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      else {
        bVar28 = bVar25 | reduce_w | bVar31;
        local_40 = CONCAT31(local_40._1_3_,bVar28);
        if (bVar28 == 0 && reduce_c) {
          pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
          if (_post_process == 0) {
            Mat::create(b,uVar15,sVar1,pAVar2);
          }
          else {
            Mat::create(b,uVar15,1,1,1,sVar1,pAVar2);
          }
          local_88.cstep = 0;
          local_88.data = (Mat *)0x0;
          local_88.refcount._0_4_ = 0;
          local_88.refcount._4_4_ = 0;
          local_88.elemsize._0_4_ = 0;
          local_88.elemsize._4_4_ = 0;
          local_88.elempack = 0;
          local_88.allocator = (Allocator *)0x0;
          local_88.dims = 0;
          local_88.w = 0;
          local_88.h = 0;
          local_88.d = 0;
          local_88.c = 0;
          pMVar27 = (Mat *)(ulong)uVar15;
          Mat::create(&local_88,uVar15,1,uVar32,sVar1,
                      *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
          local_a0 = -100;
          if ((Mat *)local_88.data != (Mat *)0x0) {
            pMVar27 = (Mat *)(local_88.cstep * (long)local_88.c);
            if (pMVar27 != (Mat *)0x0) {
              iVar13 = (int)local_88.cstep * local_88.c;
              lVar11 = 0;
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              for (; iVar13 != (int)lVar11; lVar11 = lVar11 + 1) {
                *(undefined4 *)((long)(void **)local_88.data + lVar11 * 4) = 0;
              }
              sVar1 = a->elemsize;
              sVar26 = a->cstep;
              pMVar27 = (Mat *)0x0;
              uVar22 = 0;
              if (0 < (int)uVar15) {
                uVar22 = (ulong)uVar15;
              }
              pvVar9 = a->data;
              if ((int)uVar38 < 1) {
                uVar38 = 0;
              }
              if ((int)uVar39 < 1) {
                uVar39 = 0;
              }
              if ((int)uVar32 < 1) {
                pMVar6 = pMVar27;
              }
              pMVar7 = (Mat *)local_88.data;
              for (; pMVar27 != pMVar6; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
                pvVar12 = (void *)(sVar1 * sVar26 * (long)pMVar27 + (long)pvVar9);
                for (uVar15 = 0; uVar15 != uVar39; uVar15 = uVar15 + 1) {
                  for (uVar32 = 0; uVar32 != uVar38; uVar32 = uVar32 + 1) {
                    for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                      *(float *)((long)&pMVar7->data + uVar23 * 4) =
                           ABS(*(float *)((long)pvVar12 + uVar23 * 4)) +
                           *(float *)((long)&pMVar7->data + uVar23 * 4);
                    }
                    pvVar12 = (void *)((long)pvVar12 + lVar37 * 4);
                  }
                }
                pMVar7 = (Mat *)((long)&pMVar7->data +
                                CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                                local_88.cstep);
              }
              uVar15 = b->c * (int)b->cstep;
              pvVar9 = b->data;
              uVar30 = 0;
              uVar23 = (ulong)uVar15;
              if ((int)uVar15 < 1) {
                uVar23 = uVar30;
              }
              for (; (int)uVar23 != (int)uVar30; uVar30 = uVar30 + 1) {
                *(undefined4 *)((long)pvVar9 + uVar30 * 4) = 0;
              }
              local_a0 = 0;
              pMVar7 = (Mat *)local_88.data;
              for (pMVar27 = (Mat *)0x0; pMVar27 != pMVar6;
                  pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
                pvVar9 = b->data;
                for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                  *(float *)((long)pvVar9 + uVar23 * 4) =
                       *(float *)((long)&pMVar7->data + uVar23 * 4) +
                       *(float *)((long)pvVar9 + uVar23 * 4);
                }
                pMVar7 = (Mat *)((long)&pMVar7->data +
                                CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                                local_88.cstep);
              }
            }
          }
          piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_88.allocator == (Allocator *)0x0) goto LAB_00308993;
              pMVar27 = (Mat *)local_88.data;
              (*(local_88.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        else {
          if (((reduce_w && bVar25 == 0) && !reduce_d) && !reduce_c) {
            pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
            if (_post_process == 0) {
              Mat::create(b,uVar39,uVar32,sVar1,pAVar2);
            }
            else {
              Mat::create(b,1,1,uVar39,uVar32,sVar1,pAVar2);
            }
            uVar22 = 0;
            uVar23 = 0;
            if (0 < (int)uVar35) {
              uVar23 = (ulong)uVar35;
            }
            uVar30 = (ulong)uVar39;
            if ((int)uVar39 < 1) {
              uVar30 = uVar22;
            }
            uVar36 = (ulong)uVar32;
            if ((int)uVar32 < 1) {
              uVar36 = uVar22;
            }
            sVar1 = a->elemsize;
            if (_post_process == 0) {
              sVar26 = (size_t)b->w;
            }
            else {
              sVar26 = b->cstep;
            }
            pvVar9 = a->data;
            pvVar12 = b->data;
            sVar29 = b->elemsize;
            sVar3 = a->cstep;
            pMVar27 = (Mat *)((long)(int)uVar35 * 4);
            for (; uVar22 != uVar36; uVar22 = uVar22 + 1) {
              pvVar17 = pvVar9;
              for (uVar34 = 0; uVar34 != uVar30; uVar34 = uVar34 + 1) {
                fVar40 = 0.0;
                for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
                  fVar40 = fVar40 + ABS(*(float *)((long)pvVar17 + uVar21 * 4));
                }
                *(float *)((long)pvVar12 + uVar34 * 4 + sVar26 * sVar29 * uVar22) = fVar40;
                pvVar17 = (void *)((long)&pMVar27->data + (long)pvVar17);
              }
              pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar3);
            }
            goto LAB_00308ffe;
          }
          if (((reduce_w && !reduce_h) && !reduce_d) && reduce_c) {
            pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
            if (_post_process == 0) {
              Mat::create(b,uVar38,uVar39,sVar1,pAVar2);
            }
            else {
              Mat::create(b,1,uVar38,uVar39,1,sVar1,pAVar2);
            }
            local_88.cstep = 0;
            local_88.data = (Mat *)0x0;
            local_88.refcount._0_4_ = 0;
            local_88.refcount._4_4_ = 0;
            local_88.elemsize._0_4_ = 0;
            local_88.elemsize._4_4_ = 0;
            local_88.elempack = 0;
            local_88.allocator = (Allocator *)0x0;
            local_88.dims = 0;
            local_88.w = 0;
            local_88.h = 0;
            local_88.d = 0;
            local_88.c = 0;
            pMVar27 = (Mat *)(ulong)uVar38;
            Mat::create(&local_88,uVar38,uVar39,uVar32,sVar1,
                        *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
            local_a0 = -100;
            if ((Mat *)local_88.data != (Mat *)0x0) {
              pMVar27 = (Mat *)(local_88.cstep * (long)local_88.c);
              if (pMVar27 != (Mat *)0x0) {
                iVar13 = (int)local_88.cstep * local_88.c;
                lVar11 = 0;
                if (iVar13 < 1) {
                  iVar13 = 0;
                }
                for (; iVar13 != (int)lVar11; lVar11 = lVar11 + 1) {
                  *(undefined4 *)((long)(void **)local_88.data + lVar11 * 4) = 0;
                }
                pvVar9 = a->data;
                sVar1 = a->elemsize;
                sVar26 = a->cstep;
                pMVar7 = (Mat *)0x0;
                uVar22 = 0;
                if (0 < (int)uVar15) {
                  uVar22 = (ulong)uVar15;
                }
                pMVar8 = (Mat *)(ulong)uVar38;
                if ((int)uVar38 < 1) {
                  pMVar8 = pMVar7;
                }
                pMVar16 = (Mat *)(ulong)uVar39;
                if ((int)uVar39 < 1) {
                  pMVar16 = pMVar7;
                }
                pMVar27 = pMVar6;
                if ((int)uVar32 < 1) {
                  pMVar27 = pMVar7;
                }
                for (; pMVar7 != pMVar27; pMVar7 = (Mat *)((long)&pMVar7->data + 1)) {
                  pvVar12 = (void *)(sVar1 * sVar26 * (long)pMVar7 + (long)pvVar9);
                  for (pMVar6 = (Mat *)0x0; pMVar6 != pMVar16;
                      pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
                    lVar11 = (long)local_88.w *
                             CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                             (long)pMVar6 +
                             local_88.cstep *
                             CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                             (long)pMVar7;
                    for (pMVar19 = (Mat *)0x0; pMVar19 != pMVar8;
                        pMVar19 = (Mat *)((long)&pMVar19->data + 1)) {
                      for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                        *(float *)((long)(void **)local_88.data + (long)pMVar19 * 4 + lVar11) =
                             ABS(*(float *)((long)pvVar12 + uVar23 * 4)) +
                             *(float *)((long)(void **)local_88.data + (long)pMVar19 * 4 + lVar11);
                      }
                      pvVar12 = (void *)((long)pvVar12 + lVar37 * 4);
                    }
                  }
                }
                uVar15 = b->c * (int)b->cstep;
                pvVar9 = b->data;
                uVar23 = 0;
                uVar22 = (ulong)uVar15;
                if ((int)uVar15 < 1) {
                  uVar22 = uVar23;
                }
                for (; (int)uVar22 != (int)uVar23; uVar23 = uVar23 + 1) {
                  *(undefined4 *)((long)pvVar9 + uVar23 * 4) = 0;
                }
                local_a0 = 0;
                pMVar6 = (Mat *)local_88.data;
                for (pMVar7 = (Mat *)0x0; pMVar7 != pMVar27;
                    pMVar7 = (Mat *)((long)&pMVar7->data + 1)) {
                  iVar13 = 1;
                  if (_post_process != 0) {
                    iVar13 = b->h;
                  }
                  iVar14 = b->w;
                  sVar1 = b->elemsize;
                  pvVar9 = b->data;
                  pMVar19 = pMVar6;
                  for (pMVar33 = (Mat *)0x0; pMVar33 != pMVar16;
                      pMVar33 = (Mat *)((long)&pMVar33->data + 1)) {
                    for (pMVar20 = (Mat *)0x0; pMVar8 != pMVar20;
                        pMVar20 = (Mat *)((long)&pMVar20->data + 1)) {
                      *(float *)((long)pvVar9 + (long)pMVar20 * 4) =
                           *(float *)((long)&pMVar19->data + (long)pMVar20 * 4) +
                           *(float *)((long)pvVar9 + (long)pMVar20 * 4);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data +
                                     (long)local_88.w *
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     );
                    pvVar9 = (void *)((long)pvVar9 + (long)iVar13 * sVar1 * (long)iVar14);
                  }
                  pMVar6 = (Mat *)((long)&pMVar6->data +
                                  local_88.cstep *
                                  CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
                }
              }
            }
            piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_88.allocator == (Allocator *)0x0) goto LAB_00308993;
                pMVar27 = (Mat *)local_88.data;
                (*(local_88.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          else if ((bVar31 || (reduce_w || reduce_h)) || !reduce_c) {
            if (((reduce_w && !reduce_h) && !bVar31) && !reduce_c) {
              pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
              if (_post_process == 0) {
                Mat::create(b,uVar38,uVar32,sVar1,pAVar2);
              }
              else {
                Mat::create(b,1,uVar38,1,uVar32,sVar1,pAVar2);
              }
              uVar23 = 0;
              uVar22 = (ulong)uVar38;
              if ((int)uVar38 < 1) {
                uVar22 = uVar23;
              }
              uVar30 = 0;
              if (0 < (int)uVar15) {
                uVar30 = (ulong)uVar15;
              }
              sVar1 = a->elemsize;
              if ((int)uVar39 < 1) {
                uVar39 = 0;
              }
              uVar36 = (ulong)uVar32;
              if ((int)uVar32 < 1) {
                uVar36 = uVar23;
              }
              if (_post_process == 0) {
                sVar26 = (size_t)b->w;
              }
              else {
                sVar26 = b->cstep;
              }
              pvVar9 = a->data;
              sVar29 = a->cstep;
              pMVar27 = (Mat *)(sVar26 * b->elemsize);
              pvVar12 = b->data;
              pvVar17 = pvVar12;
              for (; uVar23 != uVar36; uVar23 = uVar23 + 1) {
                for (uVar34 = 0; uVar22 != uVar34; uVar34 = uVar34 + 1) {
                  *(undefined4 *)((long)pvVar17 + uVar34 * 4) = 0;
                }
                pvVar10 = (void *)(sVar1 * sVar29 * uVar23 + (long)pvVar9);
                for (uVar15 = 0; uVar15 != uVar39; uVar15 = uVar15 + 1) {
                  for (uVar34 = 0; uVar34 != uVar22; uVar34 = uVar34 + 1) {
                    for (uVar21 = 0; uVar30 != uVar21; uVar21 = uVar21 + 1) {
                      *(float *)((long)pvVar12 + uVar34 * 4 + (long)pMVar27 * uVar23) =
                           ABS(*(float *)((long)pvVar10 + uVar21 * 4)) +
                           *(float *)((long)pvVar12 + uVar34 * 4 + (long)pMVar27 * uVar23);
                    }
                    pvVar10 = (void *)((long)pvVar10 + lVar37 * 4);
                  }
                }
                pvVar17 = (void *)((long)&pMVar27->data + (long)pvVar17);
              }
              goto LAB_00308ffe;
            }
            bVar25 = bVar25 | reduce_w | reduce_d;
            if (bVar25 != 0 || !reduce_c) {
              local_40 = CONCAT31(local_40._1_3_,bVar28 | reduce_c);
              if ((bVar28 | reduce_c) == 0) {
                pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                if (_post_process == 0) {
                  Mat::create(b,uVar15,uVar32,sVar1,pAVar2);
                }
                else {
                  Mat::create(b,uVar15,1,1,uVar32,sVar1,pAVar2);
                }
                uVar22 = 0;
                uVar23 = 0;
                if (0 < (int)uVar15) {
                  uVar23 = (ulong)uVar15;
                }
                if ((int)uVar38 < 1) {
                  uVar38 = 0;
                }
                sVar1 = a->elemsize;
                if ((int)uVar39 < 1) {
                  uVar39 = 0;
                }
                uVar30 = (ulong)uVar32;
                if ((int)uVar32 < 1) {
                  uVar30 = uVar22;
                }
                if (_post_process == 0) {
                  sVar26 = (size_t)b->w;
                }
                else {
                  sVar26 = b->cstep;
                }
                pvVar9 = a->data;
                sVar29 = a->cstep;
                pvVar12 = b->data;
                pMVar27 = (Mat *)(sVar26 * b->elemsize);
                for (; uVar22 != uVar30; uVar22 = uVar22 + 1) {
                  for (uVar36 = 0; uVar23 != uVar36; uVar36 = uVar36 + 1) {
                    *(undefined4 *)((long)pvVar12 + uVar36 * 4) = 0;
                  }
                  pvVar17 = (void *)(sVar1 * sVar29 * uVar22 + (long)pvVar9);
                  for (uVar15 = 0; uVar15 != uVar39; uVar15 = uVar15 + 1) {
                    for (uVar32 = 0; uVar32 != uVar38; uVar32 = uVar32 + 1) {
                      for (uVar36 = 0; uVar23 != uVar36; uVar36 = uVar36 + 1) {
                        *(float *)((long)pvVar12 + uVar36 * 4) =
                             ABS(*(float *)((long)pvVar17 + uVar36 * 4)) +
                             *(float *)((long)pvVar12 + uVar36 * 4);
                      }
                      pvVar17 = (void *)((long)pvVar17 + lVar37 * 4);
                    }
                  }
                  pvVar12 = (void *)((long)&pMVar27->data + (long)pvVar12);
                }
              }
              else if (((reduce_w && !reduce_h) && !reduce_d) && !reduce_c) {
                pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                if (_post_process == 0) {
                  Mat::create(b,uVar38,uVar39,uVar32,sVar1,pAVar2);
                }
                else {
                  Mat::create(b,1,uVar38,uVar39,uVar32,sVar1,pAVar2);
                }
                pvVar9 = a->data;
                sVar1 = b->elemsize;
                sVar26 = b->cstep;
                pMVar7 = (Mat *)0x0;
                pMVar27 = (Mat *)0x0;
                if (0 < (int)uVar15) {
                  pMVar27 = (Mat *)(ulong)uVar15;
                }
                sVar29 = a->elemsize;
                pMVar8 = (Mat *)(ulong)(uVar39 * uVar38);
                if ((int)(uVar39 * uVar38) < 1) {
                  pMVar8 = pMVar7;
                }
                pvVar12 = b->data;
                if ((int)uVar32 < 1) {
                  pMVar6 = pMVar7;
                }
                sVar3 = a->cstep;
                for (; pMVar7 != pMVar6; pMVar7 = (Mat *)((long)&pMVar7->data + 1)) {
                  pvVar17 = pvVar9;
                  for (pMVar16 = (Mat *)0x0; pMVar16 != pMVar8;
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1)) {
                    fVar40 = 0.0;
                    for (pMVar19 = (Mat *)0x0; pMVar27 != pMVar19;
                        pMVar19 = (Mat *)((long)&pMVar19->data + 1)) {
                      fVar40 = fVar40 + ABS(*(float *)((long)pvVar17 + (long)pMVar19 * 4));
                    }
                    *(float *)((long)pvVar12 + (long)pMVar16 * 4 + sVar1 * sVar26 * (long)pMVar7) =
                         fVar40;
                    pvVar17 = (void *)((long)pvVar17 + lVar37 * 4);
                  }
                  pvVar9 = (void *)((long)pvVar9 + sVar29 * sVar3);
                }
              }
              else if (((!reduce_w && !reduce_h) && !reduce_d) && reduce_c) {
                pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                if (_post_process == 0) {
                  Mat::create(b,uVar15,uVar38,uVar39,sVar1,pAVar2);
                }
                else {
                  Mat::create(b,uVar15,uVar38,uVar39,1,sVar1,pAVar2);
                }
                uVar18 = b->c * (int)b->cstep;
                pvVar9 = b->data;
                uVar23 = 0;
                uVar22 = (ulong)uVar18;
                if ((int)uVar18 < 1) {
                  uVar22 = uVar23;
                }
                for (; (int)uVar22 != (int)uVar23; uVar23 = uVar23 + 1) {
                  *(undefined4 *)((long)pvVar9 + uVar23 * 4) = 0;
                }
                sVar1 = a->elemsize;
                sVar26 = a->cstep;
                pMVar6 = (Mat *)0x0;
                uVar22 = 0;
                if (0 < (int)uVar15) {
                  uVar22 = (ulong)uVar15;
                }
                pvVar9 = a->data;
                pMVar7 = (Mat *)(ulong)uVar38;
                if ((int)uVar38 < 1) {
                  pMVar7 = pMVar6;
                }
                pMVar8 = (Mat *)(ulong)uVar39;
                if ((int)uVar39 < 1) {
                  pMVar8 = pMVar6;
                }
                if ((int)uVar32 < 1) {
                  pMVar27 = pMVar6;
                }
                for (; pMVar6 != pMVar27; pMVar6 = (Mat *)((long)&pMVar6->data + 1)) {
                  iVar13 = b->w;
                  if (_post_process == 0) {
                    sVar29 = b->cstep;
                  }
                  else {
                    sVar29 = (long)b->h * (long)iVar13;
                  }
                  pvVar17 = (void *)(sVar1 * sVar26 * (long)pMVar6 + (long)pvVar9);
                  pvVar12 = b->data;
                  sVar3 = b->elemsize;
                  for (pMVar16 = (Mat *)0x0; pMVar16 != pMVar8;
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1)) {
                    pvVar10 = pvVar12;
                    for (pMVar19 = (Mat *)0x0; pMVar19 != pMVar7;
                        pMVar19 = (Mat *)((long)&pMVar19->data + 1)) {
                      for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                        *(float *)((long)pvVar10 + uVar23 * 4) =
                             ABS(*(float *)((long)pvVar17 + uVar23 * 4)) +
                             *(float *)((long)pvVar10 + uVar23 * 4);
                      }
                      pvVar17 = (void *)((long)pvVar17 + lVar37 * 4);
                      pvVar10 = (void *)((long)pvVar10 + (long)iVar13 * sVar3);
                    }
                    pvVar12 = (void *)((long)pvVar12 + sVar29 * sVar3);
                  }
                }
              }
              else {
                bVar25 = bVar25 | reduce_c;
                pMVar27 = (Mat *)CONCAT71((int7)(uVar22 >> 8),bVar25);
                if (bVar25 == 0) {
                  pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                  if (_post_process == 0) {
                    Mat::create(b,uVar15,uVar39,uVar32,sVar1,pAVar2);
                  }
                  else {
                    Mat::create(b,uVar15,1,uVar39,uVar32,sVar1,pAVar2);
                  }
                  sVar1 = a->elemsize;
                  sVar26 = a->cstep;
                  pvVar9 = a->data;
                  iVar13 = b->w;
                  local_40 = b->d;
                  pvVar12 = b->data;
                  pMVar7 = (Mat *)b->elemsize;
                  local_38 = (long)b->h * (long)iVar13;
                  uVar22 = 0;
                  if (0 < (int)uVar15) {
                    uVar22 = (ulong)uVar15;
                  }
                  local_3c = b->dims;
                  if ((int)uVar38 < 1) {
                    uVar38 = 0;
                  }
                  pMVar8 = (Mat *)(ulong)uVar39;
                  if ((int)uVar39 < 1) {
                    pMVar8 = (Mat *)0x0;
                  }
                  if ((int)uVar32 < 1) {
                    pMVar6 = (Mat *)0x0;
                  }
                  sVar29 = b->cstep;
                  pMVar27 = pMVar7;
                  for (pMVar16 = (Mat *)0x0; pMVar16 != pMVar6;
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1)) {
                    iVar14 = (int)local_38;
                    if (local_3c != 4) {
                      iVar14 = (int)(((long)pMVar7 * local_38 + 0xfU & 0xfffffffffffffff0) /
                                    (ulong)pMVar7);
                    }
                    iVar4 = iVar14 * local_40;
                    if (iVar14 * local_40 < 1) {
                      iVar4 = 0;
                    }
                    for (lVar11 = 0; iVar4 != (int)lVar11; lVar11 = lVar11 + 1) {
                      *(undefined4 *)((long)pvVar12 + lVar11 * 4) = 0;
                    }
                    pvVar10 = (void *)(sVar1 * sVar26 * (long)pMVar16 + (long)pvVar9);
                    pvVar17 = pvVar12;
                    for (pMVar27 = (Mat *)0x0; pMVar27 != pMVar8;
                        pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
                      for (uVar15 = 0; uVar15 != uVar38; uVar15 = uVar15 + 1) {
                        for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                          *(float *)((long)pvVar17 + uVar23 * 4) =
                               ABS(*(float *)((long)pvVar10 + uVar23 * 4)) +
                               *(float *)((long)pvVar17 + uVar23 * 4);
                        }
                        pvVar10 = (void *)((long)pvVar10 + lVar37 * 4);
                      }
                      pvVar17 = (void *)((long)pvVar17 + (long)iVar13 * (long)pMVar7);
                    }
                    pvVar12 = (void *)((long)pvVar12 + sVar29 * (long)pMVar7);
                  }
                }
                else if ((!bVar31 && (!reduce_w && !reduce_h)) && !reduce_c) {
                  pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                  if (_post_process == 0) {
                    Mat::create(b,uVar15,uVar38,uVar32,sVar1,pAVar2);
                  }
                  else {
                    Mat::create(b,uVar15,uVar38,1,uVar32,sVar1,pAVar2);
                  }
                  sVar1 = a->elemsize;
                  sVar26 = a->cstep;
                  pvVar9 = a->data;
                  iVar13 = b->w;
                  local_40 = b->d;
                  pMVar27 = (Mat *)b->data;
                  uVar22 = b->elemsize;
                  local_38 = (long)b->h * (long)iVar13;
                  uVar23 = 0;
                  if (0 < (int)uVar15) {
                    uVar23 = (ulong)uVar15;
                  }
                  local_3c = b->dims;
                  if ((int)uVar38 < 1) {
                    uVar38 = 0;
                  }
                  if ((int)uVar39 < 1) {
                    uVar39 = 0;
                  }
                  if ((int)uVar32 < 1) {
                    pMVar6 = (Mat *)0x0;
                  }
                  sVar29 = b->cstep;
                  for (pMVar7 = (Mat *)0x0; pMVar7 != pMVar6;
                      pMVar7 = (Mat *)((long)&pMVar7->data + 1)) {
                    iVar14 = (int)local_38;
                    if (local_3c != 4) {
                      iVar14 = (int)((uVar22 * local_38 + 0xf & 0xfffffffffffffff0) / uVar22);
                    }
                    iVar4 = iVar14 * local_40;
                    if (iVar14 * local_40 < 1) {
                      iVar4 = 0;
                    }
                    for (lVar11 = 0; iVar4 != (int)lVar11; lVar11 = lVar11 + 1) {
                      *(undefined4 *)((long)&pMVar27->data + lVar11 * 4) = 0;
                    }
                    pvVar12 = (void *)(sVar1 * sVar26 * (long)pMVar7 + (long)pvVar9);
                    for (uVar15 = 0; uVar15 != uVar39; uVar15 = uVar15 + 1) {
                      pMVar8 = pMVar27;
                      for (uVar30 = 0; uVar30 != uVar38; uVar30 = uVar30 + 1) {
                        for (uVar36 = 0; uVar23 != uVar36; uVar36 = uVar36 + 1) {
                          *(float *)((long)&pMVar8->data + uVar36 * 4) =
                               ABS(*(float *)((long)pvVar12 + uVar36 * 4)) +
                               *(float *)((long)&pMVar8->data + uVar36 * 4);
                        }
                        pvVar12 = (void *)((long)pvVar12 + lVar37 * 4);
                        pMVar8 = (Mat *)((long)&pMVar8->data + (long)iVar13 * uVar22);
                      }
                    }
                    pMVar27 = (Mat *)((long)&pMVar27->data + sVar29 * uVar22);
                  }
                }
              }
              goto LAB_00308ffe;
            }
            pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
            if (_post_process == 0) {
              Mat::create(b,uVar15,uVar39,sVar1,pAVar2);
            }
            else {
              Mat::create(b,uVar15,1,uVar39,1,sVar1,pAVar2);
            }
            local_88.cstep = 0;
            local_88.data = (Mat *)0x0;
            local_88.refcount._0_4_ = 0;
            local_88.refcount._4_4_ = 0;
            local_88.elemsize._0_4_ = 0;
            local_88.elemsize._4_4_ = 0;
            local_88.elempack = 0;
            local_88.allocator = (Allocator *)0x0;
            local_88.dims = 0;
            local_88.w = 0;
            local_88.h = 0;
            local_88.d = 0;
            local_88.c = 0;
            pMVar27 = (Mat *)(ulong)uVar15;
            Mat::create(&local_88,uVar15,uVar39,uVar32,sVar1,
                        *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
            local_a0 = -100;
            if ((Mat *)local_88.data != (Mat *)0x0) {
              pMVar27 = (Mat *)(local_88.cstep * (long)local_88.c);
              if (pMVar27 != (Mat *)0x0) {
                uVar18 = (int)local_88.cstep * local_88.c;
                uVar23 = 0;
                uVar22 = (ulong)uVar18;
                if ((int)uVar18 < 1) {
                  uVar22 = uVar23;
                }
                for (; (int)uVar22 != (int)uVar23; uVar23 = uVar23 + 1) {
                  *(undefined4 *)((long)(void **)local_88.data + uVar23 * 4) = 0;
                }
                pvVar9 = a->data;
                sVar1 = a->elemsize;
                sVar26 = a->cstep;
                pMVar27 = (Mat *)0x0;
                uVar22 = 0;
                if (0 < (int)uVar15) {
                  uVar22 = (ulong)uVar15;
                }
                if ((int)uVar38 < 1) {
                  uVar38 = 0;
                }
                pMVar7 = (Mat *)(ulong)uVar39;
                if ((int)uVar39 < 1) {
                  pMVar7 = pMVar27;
                }
                if ((int)uVar32 < 1) {
                  pMVar6 = pMVar27;
                }
                pMVar8 = (Mat *)local_88.data;
                for (; pMVar27 != pMVar6; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
                  pvVar12 = (void *)(sVar1 * sVar26 * (long)pMVar27 + (long)pvVar9);
                  pMVar16 = pMVar8;
                  for (pMVar19 = (Mat *)0x0; pMVar19 != pMVar7;
                      pMVar19 = (Mat *)((long)&pMVar19->data + 1)) {
                    for (uVar15 = 0; uVar15 != uVar38; uVar15 = uVar15 + 1) {
                      for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                        *(float *)((long)&pMVar16->data + uVar23 * 4) =
                             ABS(*(float *)((long)pvVar12 + uVar23 * 4)) +
                             *(float *)((long)&pMVar16->data + uVar23 * 4);
                      }
                      pvVar12 = (void *)((long)pvVar12 + lVar37 * 4);
                    }
                    pMVar16 = (Mat *)((long)&pMVar16->data +
                                     (long)local_88.w *
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     );
                  }
                  pMVar8 = (Mat *)((long)&pMVar8->data +
                                  local_88.cstep *
                                  CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
                }
                uVar15 = b->c * (int)b->cstep;
                pvVar9 = b->data;
                uVar30 = 0;
                uVar23 = (ulong)uVar15;
                if ((int)uVar15 < 1) {
                  uVar23 = uVar30;
                }
                for (; (int)uVar23 != (int)uVar30; uVar30 = uVar30 + 1) {
                  *(undefined4 *)((long)pvVar9 + uVar30 * 4) = 0;
                }
                pMVar27 = (Mat *)(local_88.cstep *
                                 CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
                pMVar8 = (Mat *)local_88.data;
                for (pMVar16 = (Mat *)0x0; pMVar16 != pMVar6;
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1)) {
                  pvVar9 = b->data;
                  iVar13 = b->w;
                  sVar1 = b->elemsize;
                  pMVar19 = pMVar8;
                  for (pMVar33 = (Mat *)0x0; pMVar33 != pMVar7;
                      pMVar33 = (Mat *)((long)&pMVar33->data + 1)) {
                    for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                      *(float *)((long)pvVar9 + uVar23 * 4) =
                           *(float *)((long)&pMVar19->data + uVar23 * 4) +
                           *(float *)((long)pvVar9 + uVar23 * 4);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data +
                                     (long)local_88.w *
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     );
                    pvVar9 = (void *)((long)pvVar9 + (long)iVar13 * sVar1);
                  }
                  pMVar8 = (Mat *)((long)&pMVar27->data + (long)&pMVar8->data);
                }
                local_a0 = 0;
              }
            }
            piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_88.allocator == (Allocator *)0x0) goto LAB_00308993;
                pMVar27 = (Mat *)local_88.data;
                (*(local_88.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          else {
            pAVar2 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
            if (_post_process == 0) {
              Mat::create(b,uVar15,uVar38,sVar1,pAVar2);
            }
            else {
              Mat::create(b,uVar15,uVar38,1,1,sVar1,pAVar2);
            }
            local_88.cstep = 0;
            local_88.data = (Mat *)0x0;
            local_88.refcount._0_4_ = 0;
            local_88.refcount._4_4_ = 0;
            local_88.elemsize._0_4_ = 0;
            local_88.elemsize._4_4_ = 0;
            local_88.elempack = 0;
            local_88.allocator = (Allocator *)0x0;
            local_88.dims = 0;
            local_88.w = 0;
            local_88.h = 0;
            local_88.d = 0;
            local_88.c = 0;
            pMVar27 = (Mat *)(ulong)uVar15;
            Mat::create(&local_88,uVar15,uVar38,uVar32,sVar1,
                        *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
            local_a0 = -100;
            if ((Mat *)local_88.data != (Mat *)0x0) {
              pMVar27 = (Mat *)(local_88.cstep * (long)local_88.c);
              if (pMVar27 != (Mat *)0x0) {
                uVar18 = (int)local_88.cstep * local_88.c;
                uVar23 = 0;
                uVar22 = (ulong)uVar18;
                if ((int)uVar18 < 1) {
                  uVar22 = uVar23;
                }
                for (; (int)uVar22 != (int)uVar23; uVar23 = uVar23 + 1) {
                  *(undefined4 *)((long)(void **)local_88.data + uVar23 * 4) = 0;
                }
                pvVar9 = a->data;
                sVar1 = a->elemsize;
                sVar26 = a->cstep;
                pMVar27 = (Mat *)0x0;
                uVar22 = 0;
                if (0 < (int)uVar15) {
                  uVar22 = (ulong)uVar15;
                }
                pMVar7 = (Mat *)(ulong)uVar38;
                if ((int)uVar38 < 1) {
                  pMVar7 = pMVar27;
                }
                if ((int)uVar39 < 1) {
                  uVar39 = 0;
                }
                if ((int)uVar32 < 1) {
                  pMVar6 = pMVar27;
                }
                pMVar8 = (Mat *)local_88.data;
                for (; pMVar27 != pMVar6; pMVar27 = (Mat *)((long)&pMVar27->data + 1)) {
                  pvVar12 = (void *)(sVar1 * sVar26 * (long)pMVar27 + (long)pvVar9);
                  for (uVar15 = 0; uVar15 != uVar39; uVar15 = uVar15 + 1) {
                    pMVar16 = pMVar8;
                    for (pMVar19 = (Mat *)0x0; pMVar19 != pMVar7;
                        pMVar19 = (Mat *)((long)&pMVar19->data + 1)) {
                      for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                        *(float *)((long)&pMVar16->data + uVar23 * 4) =
                             ABS(*(float *)((long)pvVar12 + uVar23 * 4)) +
                             *(float *)((long)&pMVar16->data + uVar23 * 4);
                      }
                      pvVar12 = (void *)((long)pvVar12 + lVar37 * 4);
                      pMVar16 = (Mat *)((long)&pMVar16->data +
                                       (long)local_88.w *
                                       CONCAT44(local_88.elemsize._4_4_,
                                                (undefined4)local_88.elemsize));
                    }
                  }
                  pMVar8 = (Mat *)((long)&pMVar8->data +
                                  local_88.cstep *
                                  CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
                }
                uVar15 = b->c * (int)b->cstep;
                pvVar9 = b->data;
                uVar30 = 0;
                uVar23 = (ulong)uVar15;
                if ((int)uVar15 < 1) {
                  uVar23 = uVar30;
                }
                for (; (int)uVar23 != (int)uVar30; uVar30 = uVar30 + 1) {
                  *(undefined4 *)((long)pvVar9 + uVar30 * 4) = 0;
                }
                pMVar27 = (Mat *)(local_88.cstep *
                                 CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
                pMVar8 = (Mat *)local_88.data;
                for (pMVar16 = (Mat *)0x0; pMVar16 != pMVar6;
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1)) {
                  pvVar9 = b->data;
                  iVar13 = b->w;
                  sVar1 = b->elemsize;
                  pMVar19 = pMVar8;
                  for (pMVar33 = (Mat *)0x0; pMVar33 != pMVar7;
                      pMVar33 = (Mat *)((long)&pMVar33->data + 1)) {
                    for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
                      *(float *)((long)pvVar9 + uVar23 * 4) =
                           *(float *)((long)&pMVar19->data + uVar23 * 4) +
                           *(float *)((long)pvVar9 + uVar23 * 4);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data +
                                     (long)local_88.w *
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     );
                    pvVar9 = (void *)((long)pvVar9 + (long)iVar13 * sVar1);
                  }
                  pMVar8 = (Mat *)((long)&pMVar27->data + (long)&pMVar8->data);
                }
                local_a0 = 0;
              }
            }
            piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_88.allocator == (Allocator *)0x0) goto LAB_00308993;
                pMVar27 = (Mat *)local_88.data;
                (*(local_88.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
      }
    }
  }
  if (local_a0 != 0) {
    return -100;
  }
LAB_00308ffe:
  if (1.1920929e-07 < ABS(v0 + -1.0)) {
    reduction_post_process<ncnn::post_process_identity<float>>(b,v0,(Option *)pMVar27);
  }
  return 0;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_d, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_d, reduce_c, keepdims, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabsf(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }

    return 0;
}